

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_empty_write.c
# Opt level: O0

void test_empty_write(void)

{
  wchar_t wVar1;
  wchar_t wVar2;
  archive_entry *paVar3;
  archive_entry *paVar4;
  archive *a_00;
  int r;
  size_t used;
  archive *a;
  archive_entry *ae;
  char buff [32768];
  archive_entry *in_stack_ffffffffffff7fc8;
  archive_entry *in_stack_ffffffffffff7fd0;
  wchar_t in_stack_ffffffffffff7fd8;
  wchar_t in_stack_ffffffffffff7fdc;
  undefined4 in_stack_ffffffffffff7fe0;
  wchar_t in_stack_ffffffffffff7fe4;
  archive_entry *paVar5;
  void *in_stack_ffffffffffff8000;
  
  paVar3 = (archive_entry *)archive_write_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffff7fe4,in_stack_ffffffffffff7fe0),
                   in_stack_ffffffffffff7fdc,in_stack_ffffffffffff7fd8,
                   (char *)in_stack_ffffffffffff7fd0,in_stack_ffffffffffff7fc8);
  archive_write_set_format_ustar
            ((archive *)CONCAT44(in_stack_ffffffffffff7fdc,in_stack_ffffffffffff7fd8));
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffff7fe4,in_stack_ffffffffffff7fe0),
                   in_stack_ffffffffffff7fdc,in_stack_ffffffffffff7fd8,
                   (char *)in_stack_ffffffffffff7fd0,in_stack_ffffffffffff7fc8);
  wVar1 = archive_write_add_filter_gzip((archive *)paVar3);
  if (wVar1 == L'\0') {
LAB_00149a62:
    if (wVar1 == L'\0') {
LAB_00149aa9:
      assertion_equal_int((char *)paVar3,in_stack_ffffffffffff7fe4,
                          CONCAT44(wVar1,in_stack_ffffffffffff7fd8),
                          (char *)in_stack_ffffffffffff7fd0,(longlong)paVar3,(char *)0x149ada,
                          in_stack_ffffffffffff8000);
    }
    else {
      wVar2 = canGzip();
      if (wVar2 == L'\0') goto LAB_00149aa9;
      assertion_equal_int((char *)paVar3,in_stack_ffffffffffff7fe4,
                          CONCAT44(wVar1,in_stack_ffffffffffff7fd8),
                          (char *)in_stack_ffffffffffff7fd0,(longlong)paVar3,(char *)0x149aa7,
                          in_stack_ffffffffffff8000);
    }
    archive_write_open_memory
              ((archive *)paVar3,
               (void *)CONCAT44(in_stack_ffffffffffff7fe4,in_stack_ffffffffffff7fe0),
               CONCAT44(wVar1,in_stack_ffffffffffff7fd8),(size_t *)in_stack_ffffffffffff7fd0);
    paVar5 = paVar3;
    assertion_equal_int((char *)paVar3,in_stack_ffffffffffff7fe4,
                        CONCAT44(wVar1,in_stack_ffffffffffff7fd8),(char *)in_stack_ffffffffffff7fd0,
                        (longlong)paVar3,(char *)0x149b22,in_stack_ffffffffffff8000);
    paVar4 = archive_entry_new();
    assertion_assert((char *)CONCAT44(in_stack_ffffffffffff7fe4,in_stack_ffffffffffff7fe0),wVar1,
                     in_stack_ffffffffffff7fd8,(char *)in_stack_ffffffffffff7fd0,paVar3);
    archive_entry_copy_pathname(in_stack_ffffffffffff7fd0,(char *)paVar3);
    archive_entry_set_mode(paVar4,0x81ed);
    archive_entry_set_size(paVar4,0);
    archive_write_header((archive *)in_stack_ffffffffffff7fd0,paVar3);
    assertion_assert((char *)CONCAT44(in_stack_ffffffffffff7fe4,in_stack_ffffffffffff7fe0),wVar1,
                     in_stack_ffffffffffff7fd8,(char *)in_stack_ffffffffffff7fd0,paVar3);
    archive_entry_free((archive_entry *)0x149bc7);
    archive_write_data((archive *)in_stack_ffffffffffff7fd0,paVar3,0x149bdc);
    assertion_equal_int((char *)paVar5,in_stack_ffffffffffff7fe4,
                        CONCAT44(wVar1,in_stack_ffffffffffff7fd8),(char *)in_stack_ffffffffffff7fd0,
                        (longlong)paVar5,(char *)0x149c0b,in_stack_ffffffffffff8000);
    archive_write_close((archive *)0x149c15);
    assertion_equal_int((char *)paVar5,in_stack_ffffffffffff7fe4,
                        CONCAT44(wVar1,in_stack_ffffffffffff7fd8),(char *)in_stack_ffffffffffff7fd0,
                        (longlong)paVar5,(char *)0x149c44,in_stack_ffffffffffff8000);
    archive_write_free((archive *)0x149c4e);
    in_stack_ffffffffffff7fc8 = (archive_entry *)0x0;
    assertion_equal_int((char *)paVar5,in_stack_ffffffffffff7fe4,
                        CONCAT44(wVar1,in_stack_ffffffffffff7fd8),(char *)in_stack_ffffffffffff7fd0,
                        0,(char *)0x149c7c,in_stack_ffffffffffff8000);
  }
  else {
    wVar2 = canGzip();
    if (wVar2 != L'\0') goto LAB_00149a62;
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                   ,L'-');
    test_skipping("Empty write to gzip-compressed archive");
  }
  paVar3 = (archive_entry *)archive_write_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffff7fe4,in_stack_ffffffffffff7fe0),wVar1,
                   in_stack_ffffffffffff7fd8,(char *)in_stack_ffffffffffff7fd0,
                   in_stack_ffffffffffff7fc8);
  archive_write_set_format_ustar((archive *)CONCAT44(wVar1,in_stack_ffffffffffff7fd8));
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffff7fe4,in_stack_ffffffffffff7fe0),wVar1,
                   in_stack_ffffffffffff7fd8,(char *)in_stack_ffffffffffff7fd0,
                   in_stack_ffffffffffff7fc8);
  wVar1 = archive_write_add_filter_bzip2((archive *)paVar3);
  if (wVar1 != L'\0') {
    wVar2 = canBzip2();
    if (wVar2 == L'\0') {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                     ,L'O');
      test_skipping("Empty write to bzip2-compressed archive");
      goto LAB_00149f41;
    }
  }
  if (wVar1 == L'\0') {
LAB_00149d6e:
    assertion_equal_int((char *)paVar3,in_stack_ffffffffffff7fe4,
                        CONCAT44(wVar1,in_stack_ffffffffffff7fd8),(char *)in_stack_ffffffffffff7fd0,
                        (longlong)paVar3,(char *)0x149d9f,in_stack_ffffffffffff8000);
  }
  else {
    wVar2 = canBzip2();
    if (wVar2 == L'\0') goto LAB_00149d6e;
    assertion_equal_int((char *)paVar3,in_stack_ffffffffffff7fe4,
                        CONCAT44(wVar1,in_stack_ffffffffffff7fd8),(char *)in_stack_ffffffffffff7fd0,
                        (longlong)paVar3,(char *)0x149d6c,in_stack_ffffffffffff8000);
  }
  archive_write_open_memory
            ((archive *)paVar3,(void *)CONCAT44(in_stack_ffffffffffff7fe4,in_stack_ffffffffffff7fe0)
             ,CONCAT44(wVar1,in_stack_ffffffffffff7fd8),(size_t *)in_stack_ffffffffffff7fd0);
  paVar5 = paVar3;
  assertion_equal_int((char *)paVar3,in_stack_ffffffffffff7fe4,
                      CONCAT44(wVar1,in_stack_ffffffffffff7fd8),(char *)in_stack_ffffffffffff7fd0,
                      (longlong)paVar3,(char *)0x149de7,in_stack_ffffffffffff8000);
  paVar4 = archive_entry_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffff7fe4,in_stack_ffffffffffff7fe0),wVar1,
                   in_stack_ffffffffffff7fd8,(char *)in_stack_ffffffffffff7fd0,paVar3);
  archive_entry_copy_pathname(in_stack_ffffffffffff7fd0,(char *)paVar3);
  archive_entry_set_mode(paVar4,0x81ed);
  archive_entry_set_size(paVar4,0);
  archive_write_header((archive *)in_stack_ffffffffffff7fd0,paVar3);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffff7fe4,in_stack_ffffffffffff7fe0),wVar1,
                   in_stack_ffffffffffff7fd8,(char *)in_stack_ffffffffffff7fd0,paVar3);
  archive_entry_free((archive_entry *)0x149e8c);
  archive_write_data((archive *)in_stack_ffffffffffff7fd0,paVar3,0x149ea1);
  assertion_equal_int((char *)paVar5,in_stack_ffffffffffff7fe4,
                      CONCAT44(wVar1,in_stack_ffffffffffff7fd8),(char *)in_stack_ffffffffffff7fd0,
                      (longlong)paVar5,(char *)0x149ed0,in_stack_ffffffffffff8000);
  archive_write_close((archive *)0x149eda);
  assertion_equal_int((char *)paVar5,in_stack_ffffffffffff7fe4,
                      CONCAT44(wVar1,in_stack_ffffffffffff7fd8),(char *)in_stack_ffffffffffff7fd0,
                      (longlong)paVar5,(char *)0x149f09,in_stack_ffffffffffff8000);
  archive_write_free((archive *)0x149f13);
  in_stack_ffffffffffff7fc8 = (archive_entry *)0x0;
  assertion_equal_int((char *)paVar5,in_stack_ffffffffffff7fe4,
                      CONCAT44(wVar1,in_stack_ffffffffffff7fd8),(char *)in_stack_ffffffffffff7fd0,0,
                      (char *)0x149f41,in_stack_ffffffffffff8000);
LAB_00149f41:
  a_00 = archive_write_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffff7fe4,in_stack_ffffffffffff7fe0),wVar1,
                   in_stack_ffffffffffff7fd8,(char *)in_stack_ffffffffffff7fd0,
                   in_stack_ffffffffffff7fc8);
  archive_write_set_format_ustar((archive *)CONCAT44(wVar1,in_stack_ffffffffffff7fd8));
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffff7fe4,in_stack_ffffffffffff7fe0),wVar1,
                   in_stack_ffffffffffff7fd8,(char *)in_stack_ffffffffffff7fd0,
                   in_stack_ffffffffffff7fc8);
  archive_write_add_filter_none(a_00);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffff7fe4,in_stack_ffffffffffff7fe0),wVar1,
                   in_stack_ffffffffffff7fd8,(char *)in_stack_ffffffffffff7fd0,
                   in_stack_ffffffffffff7fc8);
  archive_write_open_memory
            (a_00,(void *)CONCAT44(in_stack_ffffffffffff7fe4,in_stack_ffffffffffff7fe0),
             CONCAT44(wVar1,in_stack_ffffffffffff7fd8),(size_t *)in_stack_ffffffffffff7fd0);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffff7fe4,in_stack_ffffffffffff7fe0),wVar1,
                   in_stack_ffffffffffff7fd8,(char *)in_stack_ffffffffffff7fd0,
                   in_stack_ffffffffffff7fc8);
  paVar3 = archive_entry_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffff7fe4,in_stack_ffffffffffff7fe0),wVar1,
                   in_stack_ffffffffffff7fd8,(char *)in_stack_ffffffffffff7fd0,
                   in_stack_ffffffffffff7fc8);
  archive_entry_copy_pathname(in_stack_ffffffffffff7fd0,(char *)in_stack_ffffffffffff7fc8);
  archive_entry_set_mode(paVar3,0x81ed);
  archive_entry_set_size(paVar3,0);
  archive_write_header((archive *)in_stack_ffffffffffff7fd0,in_stack_ffffffffffff7fc8);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffff7fe4,in_stack_ffffffffffff7fe0),wVar1,
                   in_stack_ffffffffffff7fd8,(char *)in_stack_ffffffffffff7fd0,
                   in_stack_ffffffffffff7fc8);
  archive_entry_free((archive_entry *)0x14a0c7);
  archive_write_data((archive *)in_stack_ffffffffffff7fd0,in_stack_ffffffffffff7fc8,0x14a0dc);
  assertion_equal_int((char *)a_00,in_stack_ffffffffffff7fe4,
                      CONCAT44(wVar1,in_stack_ffffffffffff7fd8),(char *)in_stack_ffffffffffff7fd0,
                      (longlong)a_00,(char *)0x14a10b,in_stack_ffffffffffff8000);
  archive_write_close((archive *)0x14a115);
  assertion_equal_int((char *)a_00,in_stack_ffffffffffff7fe4,
                      CONCAT44(wVar1,in_stack_ffffffffffff7fd8),(char *)in_stack_ffffffffffff7fd0,
                      (longlong)a_00,(char *)0x14a144,in_stack_ffffffffffff8000);
  archive_write_free((archive *)0x14a14e);
  assertion_equal_int((char *)a_00,in_stack_ffffffffffff7fe4,
                      CONCAT44(wVar1,in_stack_ffffffffffff7fd8),(char *)in_stack_ffffffffffff7fd0,0,
                      (char *)0x14a17c,in_stack_ffffffffffff8000);
  return;
}

Assistant:

DEFINE_TEST(test_empty_write)
{
	char buff[32768];
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	int r;

	/*
	 * Exercise a zero-byte write to a gzip-compressed archive.
	 */

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_ustar(a));
	r = archive_write_add_filter_gzip(a);
	if (r != ARCHIVE_OK && !canGzip()) {
		skipping("Empty write to gzip-compressed archive");
	} else {
		if (r != ARCHIVE_OK && canGzip())
			assertEqualIntA(a, ARCHIVE_WARN, r);
		else
			assertEqualIntA(a, ARCHIVE_OK, r);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_open_memory(a, buff, sizeof(buff), &used));
		/* Write a file to it. */
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, "file");
		archive_entry_set_mode(ae, S_IFREG | 0755);
		archive_entry_set_size(ae, 0);
		assertA(0 == archive_write_header(a, ae));
		archive_entry_free(ae);

		/* THE TEST: write zero bytes to this entry. */
		/* This used to crash. */
		assertEqualIntA(a, 0, archive_write_data(a, "", 0));

		/* Close out the archive. */
		assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
	}

	/*
	 * Again, with bzip2 compression.
	 */

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_ustar(a));
	r = archive_write_add_filter_bzip2(a);
	if (r != ARCHIVE_OK && !canBzip2()) {
		skipping("Empty write to bzip2-compressed archive");
	} else {
		if (r != ARCHIVE_OK && canBzip2())
			assertEqualIntA(a, ARCHIVE_WARN, r);
		else
			assertEqualIntA(a, ARCHIVE_OK, r);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_open_memory(a, buff, sizeof(buff), &used));
		/* Write a file to it. */
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, "file");
		archive_entry_set_mode(ae, S_IFREG | 0755);
		archive_entry_set_size(ae, 0);
		assertA(0 == archive_write_header(a, ae));
		archive_entry_free(ae);

		/* THE TEST: write zero bytes to this entry. */
		assertEqualIntA(a, 0, archive_write_data(a, "", 0));

		/* Close out the archive. */
		assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
	}

	/*
	 * For good measure, one more time with no compression.
	 */

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_ustar(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_open_memory(a, buff, sizeof(buff), &used));
	/* Write a file to it. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 0);
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);

	/* THE TEST: write zero bytes to this entry. */
	assertEqualIntA(a, 0, archive_write_data(a, "", 0));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));
}